

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void __thiscall sliced_chunk_iterator::cleanup(sliced_chunk_iterator *this,EVP_PKEY_CTX *ctx)

{
  if (this->next == 0x7fffffffffffffff) {
    return;
  }
  fseek((FILE *)this->ctx->actual,this->next,0);
  fseek((FILE *)this->ctx->expect,this->next,0);
  comparer_context::pop_length(this->ctx);
  return;
}

Assistant:

void cleanup() {
        if(next != std::numeric_limits<long>::max()) {
            fseek(ctx.get_actual(),next,SEEK_SET);
            fseek(ctx.get_expect(),next,SEEK_SET);

            ctx.pop_length();
        }
    }